

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdialog.cpp
# Opt level: O2

void QDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined4 uVar2;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      finished((QDialog *)_o,*_a[1]);
      return;
    case 1:
      accepted((QDialog *)_o);
      return;
    case 2:
      rejected((QDialog *)_o);
      return;
    case 3:
      (**(code **)(*(long *)_o + 0x1a0))();
      return;
    case 4:
      uVar2 = (**(code **)(*(long *)_o + 0x1a8))();
      if ((undefined4 *)*_a != (undefined4 *)0x0) {
        *(undefined4 *)*_a = uVar2;
      }
      break;
    case 5:
      (**(code **)(*(long *)_o + 0x1b0))(_o,*_a[1]);
      return;
    case 6:
      (**(code **)(*(long *)_o + 0x1b8))();
      return;
    case 7:
      (**(code **)(*(long *)_o + 0x1c0))();
      return;
    }
    break;
  case ReadProperty:
    if (_id == 1) {
      bVar1 = (*(uint *)(*(long *)(_o + 0x20) + 0x10) & 0x30000) == 0;
    }
    else {
      if (_id != 0) {
        return;
      }
      bVar1 = *(long *)(*(long *)(_o + 8) + 0x298) == 0;
    }
    *(bool *)*_a = !bVar1;
    break;
  case WriteProperty:
    if (_id == 1) {
      setModal((QDialog *)_o,**_a);
      return;
    }
    if (_id == 0) {
      setSizeGripEnabled((QDialog *)_o,**_a);
      return;
    }
    break;
  case IndexOfMethod:
    bVar1 = QtMocHelpers::indexOfMethod<void(QDialog::*)(int)>
                      ((QtMocHelpers *)_a,(void **)finished,0,0);
    if ((!bVar1) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QDialog::*)()>
                          ((QtMocHelpers *)_a,(void **)accepted,0,1), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QDialog::*)()>((QtMocHelpers *)_a,(void **)rejected,0,2);
      return;
    }
  }
  return;
}

Assistant:

void QDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->accepted(); break;
        case 2: _t->rejected(); break;
        case 3: _t->open(); break;
        case 4: { int _r = _t->exec();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 5: _t->done((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->accept(); break;
        case 7: _t->reject(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)(int )>(_a, &QDialog::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)()>(_a, &QDialog::accepted, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)()>(_a, &QDialog::rejected, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isSizeGripEnabled(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isModal(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSizeGripEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setModal(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}